

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  cmGlobalGenerator *globalGenerator;
  undefined4 extraout_var_00;
  char *__s;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  string *psVar11;
  string *psVar12;
  bool bVar13;
  int result_1;
  string dep_newest;
  string out_oldest;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  int local_1a6c;
  undefined1 local_1a68 [44];
  undefined4 local_1a3c;
  string local_1a38;
  string local_1a18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19b8;
  undefined1 local_1998 [16];
  undefined1 local_1988 [2016];
  undefined1 local_11a8 [112];
  ios_base local_1138 [1912];
  cmake local_9c0;
  cmGlobalGenerator local_638;
  long *plVar7;
  
  bVar2 = cmsys::SystemTools::HasEnv("VERBOSE");
  if (bVar2) {
    bVar2 = cmsys::SystemTools::HasEnv("CMAKE_NO_VERBOSE");
    uVar9 = CONCAT71(extraout_var,bVar2) & 0xffffffff ^ 1;
  }
  else {
    uVar9 = 0;
  }
  cVar8 = (char)uVar9;
  if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
    if (cVar8 == '\0') {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_11a8,"Re-run cmake no build system arguments\n",0x27);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_1998);
LAB_002247ec:
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11a8);
    std::ios_base::~ios_base(local_1138);
    return 1;
  }
  bVar2 = cmsys::SystemTools::FileExists(&this->CheckBuildSystemArgument);
  if (!bVar2) {
    if (cVar8 == '\0') {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_11a8,"Re-run cmake missing file: ",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_11a8,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                        (this->CheckBuildSystemArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_1998);
    goto LAB_002247ec;
  }
  cmake(&local_9c0,RoleScript,Unknown);
  pcVar1 = local_11a8 + 0x10;
  local_11a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"");
  SetHomeDirectory(&local_9c0,(string *)local_11a8);
  if ((pointer)local_11a8._0_8_ != pcVar1) {
    operator_delete((void *)local_11a8._0_8_,local_11a8._16_8_ + 1);
  }
  local_11a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"");
  SetHomeOutputDirectory(&local_9c0,(string *)local_11a8);
  if ((pointer)local_11a8._0_8_ != pcVar1) {
    operator_delete((void *)local_11a8._0_8_,local_11a8._16_8_ + 1);
  }
  local_11a8._16_8_ = local_9c0.CurrentSnapshot.Position.Position;
  local_11a8._0_8_ = local_9c0.CurrentSnapshot.State;
  local_11a8._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_11a8);
  cmGlobalGenerator::cmGlobalGenerator(&local_638,&local_9c0);
  local_1988._0_8_ = local_9c0.CurrentSnapshot.Position.Position;
  local_1998._0_8_ = local_9c0.CurrentSnapshot.State;
  local_1998._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_11a8,&local_638,(cmStateSnapshot *)local_1998);
  bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_11a8,&this->CheckBuildSystemArgument);
  if ((((!bVar2) || (cmSystemTools::s_ErrorOccured != false)) ||
      (cmSystemTools::s_FatalErrorOccured != false)) ||
     (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)) {
    uVar10 = 1;
    if (cVar8 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1998,"Re-run cmake error reading : ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1998,(this->CheckBuildSystemArgument)._M_dataplus._M_p,
                          (this->CheckBuildSystemArgument)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)local_1a68);
      if ((cmState *)local_1a68._0_8_ != (cmState *)(local_1a68 + 0x10)) {
        operator_delete((void *)local_1a68._0_8_,local_1a68._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
      std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
    }
    goto LAB_002246e2;
  }
  if (this->ClearBuildSystem == true) {
    local_1998._0_8_ = (cmState *)local_1988;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1998,"CMAKE_DEPENDS_GENERATOR","");
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_1998);
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = "Unix Makefiles";
    }
    local_1998._0_8_ = (cmState *)local_1988;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,pcVar5,pcVar5 + sVar6);
    globalGenerator = CreateGlobalGenerator(this,(string *)local_1998);
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
    }
    if (globalGenerator != (cmGlobalGenerator *)0x0) {
      local_1988._0_8_ = local_9c0.CurrentSnapshot.Position.Position;
      local_1998._0_8_ = local_9c0.CurrentSnapshot.State;
      local_1998._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1998);
      local_1a68._16_8_ = local_9c0.CurrentSnapshot.Position.Position;
      local_1a68._0_8_ = local_9c0.CurrentSnapshot.State;
      local_1a68._8_8_ = local_9c0.CurrentSnapshot.Position.Tree;
      cmMakefile::cmMakefile((cmMakefile *)local_1998,globalGenerator,(cmStateSnapshot *)local_1a68)
      ;
      iVar3 = (*globalGenerator->_vptr_cmGlobalGenerator[2])(globalGenerator,local_1998);
      plVar7 = (long *)CONCAT44(extraout_var_00,iVar3);
      (**(code **)(*plVar7 + 0x50))(plVar7,local_1998,uVar9 & 0xff);
      (**(code **)(*plVar7 + 8))(plVar7);
      cmMakefile::~cmMakefile((cmMakefile *)local_1998);
      (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
    }
  }
  local_19b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_19b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_19b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1998._0_8_ = (cmState *)local_1988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,"CMAKE_MAKEFILE_PRODUCTS","")
  ;
  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_1998);
  if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
    operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
  }
  psVar12 = local_19b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar11 = local_19b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar5 != (char *)0x0) {
    local_1998._0_8_ = (cmState *)local_1988;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,pcVar5,pcVar5 + sVar6);
    cmSystemTools::ExpandListArgument((string *)local_1998,&local_19b8,false);
    psVar12 = local_19b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar11 = local_19b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
      psVar12 = local_19b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar11 = local_19b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  for (; psVar12 != psVar11; psVar12 = psVar12 + 1) {
    bVar2 = cmsys::SystemTools::FileExists(psVar12);
    if ((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(psVar12), !bVar2)) {
      uVar10 = 1;
      if (cVar8 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1998,"Re-run cmake, missing byproduct: ",0x21);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1998,(psVar12->_M_dataplus)._M_p,
                            psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout((string *)local_1a68);
        if ((cmState *)local_1a68._0_8_ != (cmState *)(local_1a68 + 0x10)) {
          operator_delete((void *)local_1a68._0_8_,local_1a68._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
        std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
      }
      goto LAB_00225149;
    }
  }
  local_19d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_19d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_19d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1998._0_8_ = (cmState *)local_1988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,"CMAKE_MAKEFILE_DEPENDS","");
  pcVar5 = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_1998);
  if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
    operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
  }
  local_1998._0_8_ = (cmState *)local_1988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,"CMAKE_MAKEFILE_OUTPUTS","");
  __s = cmMakefile::GetDefinition((cmMakefile *)local_11a8,(string *)local_1998);
  if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
    operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
  }
  if (__s != (char *)0x0 && pcVar5 != (char *)0x0) {
    local_1998._0_8_ = (cmState *)local_1988;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,pcVar5,pcVar5 + sVar6);
    cmSystemTools::ExpandListArgument((string *)local_1998,&local_19d8,false);
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
    }
    local_1998._0_8_ = (cmState *)local_1988;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1998,__s,__s + sVar6);
    cmSystemTools::ExpandListArgument((string *)local_1998,&local_19f8,false);
    if ((cmState *)local_1998._0_8_ != (cmState *)local_1988) {
      operator_delete((void *)local_1998._0_8_,local_1988._0_8_ + 1);
    }
  }
  psVar11 = local_19d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_19d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_19d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_19f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_19f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_1a3c = (undefined4)uVar9;
    local_1a68._0_8_ = local_1a68 + 0x10;
    pcVar1 = ((local_19d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a68,pcVar1,
               pcVar1 + (local_19d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    do {
      psVar12 = local_19f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar11 = psVar11 + 1;
      if (psVar11 ==
          local_19d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_1a38._M_dataplus._M_p = (pointer)&local_1a38.field_2;
        pcVar1 = ((local_19f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a38,pcVar1,
                   pcVar1 + (local_19f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        goto LAB_00224f01;
      }
      local_1a18._M_dataplus._M_p._0_4_ = 0;
      bVar2 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,
                         (string *)local_1a68,psVar11,(int *)&local_1a18);
      if (bVar2) {
        if ((int)local_1a18._M_dataplus._M_p < 0) {
          std::__cxx11::string::_M_assign((string *)local_1a68);
        }
      }
      else if ((char)local_1a3c != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1998,"Re-run cmake: build system dependency is missing\n",0x31);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(&local_1a38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a38._M_dataplus._M_p != &local_1a38.field_2) {
          operator_delete(local_1a38._M_dataplus._M_p,local_1a38.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
        std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
      }
    } while (bVar2);
    uVar10 = 1;
    goto LAB_00225118;
  }
  uVar10 = 1;
  if (cVar8 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1998,
               "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n",0x43);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)local_1a68);
    if ((cmState *)local_1a68._0_8_ != (cmState *)(local_1a68 + 0x10)) {
      operator_delete((void *)local_1a68._0_8_,local_1a68._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
    std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
  }
  goto LAB_0022512f;
  while( true ) {
    local_1a6c = 0;
    bVar2 = cmFileTimeCache::Compare
                      ((this->FileTimeCache)._M_t.
                       super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                       .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&local_1a38,
                       psVar12,&local_1a6c);
    if (bVar2) {
      if (0 < local_1a6c) {
        std::__cxx11::string::_M_assign((string *)&local_1a38);
      }
    }
    else if ((char)local_1a3c != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1998,"Re-run cmake: build system output is missing\n",0x2d);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(&local_1a18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a18._M_dataplus._M_p._4_4_,(int)local_1a18._M_dataplus._M_p) !=
          &local_1a18.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a18._M_dataplus._M_p._4_4_,(int)local_1a18._M_dataplus._M_p)
                        ,local_1a18.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
      std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
    }
    if (!bVar2) break;
LAB_00224f01:
    psVar12 = psVar12 + 1;
    if (psVar12 ==
        local_19f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a6c = 0;
      bVar2 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&local_1a38,
                         (string *)local_1a68,&local_1a6c);
      bVar13 = local_1a6c < 0;
      if ((char)local_1a3c == '\x01' && (!bVar2 || bVar13)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1998);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1998,"Re-run cmake file: ",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1998,local_1a38._M_dataplus._M_p,
                            local_1a38._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," older than: ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_1a68._0_8_,local_1a68._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(&local_1a18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a18._M_dataplus._M_p._4_4_,(int)local_1a18._M_dataplus._M_p) !=
            &local_1a18.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1a18._M_dataplus._M_p._4_4_,
                                   (int)local_1a18._M_dataplus._M_p),
                          local_1a18.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1998);
        std::ios_base::~ios_base((ios_base *)(local_1988 + 0x60));
      }
      uVar10 = (uint)(!bVar2 || bVar13);
      goto LAB_002250f7;
    }
  }
  uVar10 = 1;
LAB_002250f7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a38._M_dataplus._M_p != &local_1a38.field_2) {
    operator_delete(local_1a38._M_dataplus._M_p,local_1a38.field_2._M_allocated_capacity + 1);
  }
LAB_00225118:
  if ((cmState *)local_1a68._0_8_ != (cmState *)(local_1a68 + 0x10)) {
    operator_delete((void *)local_1a68._0_8_,local_1a68._16_8_ + 1);
  }
LAB_0022512f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_19f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_19d8);
LAB_00225149:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_19b8);
LAB_002246e2:
  cmMakefile::~cmMakefile((cmMakefile *)local_11a8);
  cmGlobalGenerator::~cmGlobalGenerator(&local_638);
  ~cmake(&local_9c0);
  return uVar10;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    const char* genName = mf.GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!genName || genName[0] == '\0') {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd(
      this->CreateGlobalGenerator(genName));
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      std::unique_ptr<cmLocalGenerator> lgd(ggd->CreateLocalGenerator(&mfd));
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if (const char* productStr = mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS")) {
    cmSystemTools::ExpandListArgument(productStr, products);
  }
  for (std::string const& p : products) {
    if (!(cmSystemTools::FileExists(p) || cmSystemTools::FileIsSymlink(p))) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << p << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if (dependsStr && outputsStr) {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
             "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}